

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

undefined8 Catch::toString_abi_cxx11_(unsigned_long value)

{
  ostream *this;
  void *this_00;
  ulong in_RSI;
  undefined8 in_RDI;
  ostringstream oss;
  ostringstream local_188 [376];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  if (local_10 < 0x2001) {
    std::ostream::operator<<(local_188,local_10);
  }
  else {
    this = std::operator<<((ostream *)local_188,"0x");
    this_00 = (void *)std::ostream::operator<<(this,std::hex);
    std::ostream::operator<<(this_00,local_10);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

inline std::string toString( unsigned long value ) {
    std::ostringstream oss;
    if( value > 8192 )
        oss << "0x" << std::hex << value;
    else
        oss << value;
    return oss.str();
}